

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O2

int __thiscall QtMWidgets::PageViewPrivate::init(PageViewPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QWidget *parent;
  PageControl *this_00;
  QVariantAnimation *this_01;
  
  parent = (QWidget *)operator_new(0x28);
  QWidget::QWidget(parent,this->q,0);
  this->viewport = parent;
  this_00 = (PageControl *)operator_new(0x30);
  PageControl::PageControl(this_00,parent);
  this->control = this_00;
  iVar1 = FingerGeometry::height();
  this->controlOffset = iVar1 / 2;
  this_01 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(this_01,(QObject *)this->q);
  this->normalizeAnimation = this_01;
  QVariantAnimation::setDuration((int)this_01);
  iVar1 = QAbstractAnimation::setLoopCount((int)this->normalizeAnimation);
  return iVar1;
}

Assistant:

void
PageViewPrivate::init()
{
	viewport = new QWidget( q );

	control = new PageControl( viewport );

	controlOffset = FingerGeometry::height() / 2;

	normalizeAnimation = new QVariantAnimation( q );

	normalizeAnimation->setDuration( 300 );

	normalizeAnimation->setLoopCount( 1 );
}